

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O1

int server::clientconnect(int n,uint ip,char *ipstr)

{
  uint uVar1;
  int iVar2;
  clientinfo *ci;
  string cm;
  clientinfo *local_128;
  stringformatter local_120;
  char local_118 [264];
  
  if (n < 0x80) {
    local_128 = (clientinfo *)getclientinfo(n);
  }
  else if (n + -0x80 < DAT_00194cc4) {
    local_128 = *(clientinfo **)(bots + (long)(n + -0x80) * 8);
  }
  else {
    local_128 = (clientinfo *)0x0;
  }
  local_128->ip = ipstr;
  local_120.buf = local_118;
  stringformatter::operator()(&local_120,"IP: %s",local_128->ip);
  if (showclientips != 0) {
    privilegemsg(3,local_118);
  }
  local_128->ownernum = n;
  local_128->clientnum = n;
  local_128->connectmillis = totalmillis;
  uVar1 = randomMT();
  local_128->sessionid = (totalmillis % 10000 + 1) * uVar1 & 0xffffff;
  vector<server::clientinfo_*>::add((vector<server::clientinfo_*> *)&connects,&local_128);
  if (local_128->isSpecLocked == true) {
    forcespectator(local_128);
  }
  if (local_128->votedmapsucks == true) {
    local_128->votedmapsucks = true;
  }
  iVar2 = 2;
  if (gamemode < 0x17) {
    sendservinfo(local_128);
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int clientconnect(int n, uint ip, char *ipstr)
    {
        clientinfo *ci = getinfo(n);
        ci->ip=ipstr; //QServ ci->ip
        defformatstring(cm)("IP: %s", ci->ip);
        if(showclientips) privilegemsg(PRIV_ADMIN, cm);
        ci->clientnum = ci->ownernum = n;
        ci->connectmillis = totalmillis;
        ci->sessionid = (rnd(0x1000000)*((totalmillis%10000)+1))&0xFFFFFF;
        connects.add(ci);
        if(ci->isSpecLocked) forcespectator(ci);
        if(ci->votedmapsucks) ci->votedmapsucks = true;
        if(!m_mp(gamemode)) return DISC_LOCAL;
        sendservinfo(ci);
        return DISC_NONE;
    }